

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.h
# Opt level: O1

void __thiscall
slang::ast::StreamingConcatenationExpression::visitExprs<slang::ast::builtins::MonitorVisitor&>
          (StreamingConcatenationExpression *this,MonitorVisitor *visitor)

{
  pointer pSVar1;
  size_type sVar2;
  Expression *pEVar3;
  pointer pSVar4;
  
  sVar2 = (this->streams_).size_;
  if (sVar2 != 0) {
    pSVar4 = (this->streams_).data_;
    pSVar1 = pSVar4 + sVar2;
    do {
      pEVar3 = (pSVar4->operand).ptr;
      if (pEVar3 == (Expression *)0x0) {
        assert::assertFailed
                  ("ptr",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                   ,0x26,
                   "T slang::not_null<const slang::ast::Expression *>::get() const [T = const slang::ast::Expression *]"
                  );
      }
      Expression::
      visitExpression<slang::ast::Expression_const,slang::ast::builtins::MonitorVisitor&>
                (pEVar3,pEVar3,visitor);
      pEVar3 = pSVar4->withExpr;
      if (pEVar3 != (Expression *)0x0) {
        Expression::
        visitExpression<slang::ast::Expression_const,slang::ast::builtins::MonitorVisitor&>
                  (pEVar3,pEVar3,visitor);
      }
      pSVar4 = pSVar4 + 1;
    } while (pSVar4 != pSVar1);
  }
  return;
}

Assistant:

span<const StreamExpression> streams() const { return streams_; }